

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O2

DdNode * Extra_zddRandomSet(DdManager *dd,int n,int k,double d)

{
  int iVar1;
  int *VarValues;
  time_t seed;
  long lVar2;
  DdNode *n_00;
  DdNode *pDVar3;
  ulong uVar4;
  DdNode *local_58;
  
  if ((((d <= 1.0) && (0 < n)) && (0 < k)) && (0.0 <= d)) {
    VarValues = (int *)malloc((ulong)(uint)n * 4);
    if (VarValues != (int *)0x0) {
      local_58 = dd->zero;
      Cudd_Ref(local_58);
      iVar1 = 0;
      seed = time((time_t *)0x0);
      Cudd_Srandom(seed);
      do {
        while( true ) {
          if (k <= iVar1) {
            free(VarValues);
            Cudd_Deref(local_58);
            return local_58;
          }
          for (uVar4 = 0; (uint)n != uVar4; uVar4 = uVar4 + 1) {
            lVar2 = Cudd_Random();
            VarValues[uVar4] = (uint)(lVar2 <= (int)(d * 2147483561.0));
          }
          n_00 = Extra_zddCombination(dd,VarValues,n);
          Cudd_Ref(n_00);
          if (iVar1 != 0) break;
LAB_0067e3eb:
          pDVar3 = Cudd_zddUnion(dd,local_58,n_00);
          Cudd_Ref(pDVar3);
          Cudd_RecursiveDerefZdd(dd,local_58);
          Cudd_RecursiveDerefZdd(dd,n_00);
          iVar1 = iVar1 + 1;
          local_58 = pDVar3;
        }
        pDVar3 = Cudd_zddDiff(dd,local_58,n_00);
        Cudd_Ref(pDVar3);
        if (pDVar3 == local_58) {
          Cudd_Deref(pDVar3);
          goto LAB_0067e3eb;
        }
        Cudd_RecursiveDerefZdd(dd,pDVar3);
        Cudd_RecursiveDerefZdd(dd,n_00);
      } while( true );
    }
    dd->errorCode = CUDD_MEMORY_OUT;
  }
  return (DdNode *)0x0;
}

Assistant:

DdNode* Extra_zddRandomSet( 
  DdManager * dd,   /* the DD manager */
  int n,            /* the number of elements */
  int k,            /* the number of combinations (subsets) */
  double d)         /* average density of elements in combinations */
{
    DdNode *Result, *TempComb, *Aux;
    int c, v, Limit, *VarValues;

    /* sanity check the parameters */
    if ( n <= 0 || k <= 0 || d < 0.0 || d > 1.0 )
        return NULL;

    /* allocate temporary storage for variable values */
    VarValues = ABC_ALLOC( int, n );
    if (VarValues == NULL) 
    {
        dd->errorCode = CUDD_MEMORY_OUT;
        return NULL;
    }

    /* start the new set */
    Result = dd->zero;
    Cudd_Ref( Result );

    /* seed random number generator */
    Cudd_Srandom( time(NULL) );
//  Cudd_Srandom( 4 );
    /* determine the limit below which var belongs to the combination */
    Limit = (int)(d * 2147483561.0);

    /* add combinations one by one */
    for ( c = 0; c < k; c++ )
    {
        for ( v = 0; v < n; v++ )
            if ( Cudd_Random() <= Limit )
                VarValues[v] = 1;
            else
                VarValues[v] = 0;

        TempComb = Extra_zddCombination( dd, VarValues, n );
        Cudd_Ref( TempComb );

        /* make sure that this combination is not already in the set */
        if ( c )
        { /* at least one combination is already included */

            Aux = Cudd_zddDiff( dd, Result, TempComb );
            Cudd_Ref( Aux );
            if ( Aux != Result )
            {
                Cudd_RecursiveDerefZdd( dd, Aux );
                Cudd_RecursiveDerefZdd( dd, TempComb );
                c--;
                continue;
            }
            else 
            { /* Aux is the same node as Result */
                Cudd_Deref( Aux );
            }
        }

        Result = Cudd_zddUnion( dd, Aux = Result, TempComb );
        Cudd_Ref( Result );
        Cudd_RecursiveDerefZdd( dd, Aux );
        Cudd_RecursiveDerefZdd( dd, TempComb );
    }

    ABC_FREE( VarValues );
    Cudd_Deref( Result );
    return Result;

}